

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

void __thiscall xe::TestNode::getFullPath(TestNode *this,string *dst)

{
  int iVar1;
  TestNodeType TVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char *local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  int local_2c;
  TestGroup *pTStack_28;
  int pos;
  TestNode *curNode;
  string *psStack_18;
  int nameLen;
  string *dst_local;
  TestNode *this_local;
  
  psStack_18 = dst;
  dst_local = (string *)this;
  std::__cxx11::string::clear();
  curNode._4_4_ = 0;
  pTStack_28 = (TestGroup *)this;
  while( true ) {
    iVar1 = std::__cxx11::string::length();
    curNode._4_4_ = iVar1 + curNode._4_4_;
    TVar2 = getNodeType(&((pTStack_28->super_TestNode).m_parent)->super_TestNode);
    if (TVar2 == TESTNODETYPE_ROOT) break;
    curNode._4_4_ = curNode._4_4_ + 1;
    pTStack_28 = (pTStack_28->super_TestNode).m_parent;
  }
  std::__cxx11::string::resize((ulong)psStack_18);
  local_2c = curNode._4_4_;
  pTStack_28 = (TestGroup *)this;
  while( true ) {
    local_38._M_current = (char *)std::__cxx11::string::begin();
    local_40._M_current = (char *)std::__cxx11::string::end();
    local_50._M_current = (char *)std::__cxx11::string::begin();
    lVar3 = (long)local_2c;
    lVar4 = std::__cxx11::string::length();
    local_48 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_50,lVar3 - lVar4);
    std::
    copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (local_38,local_40,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_48);
    iVar1 = std::__cxx11::string::length();
    local_2c = local_2c - iVar1;
    TVar2 = getNodeType(&((pTStack_28->super_TestNode).m_parent)->super_TestNode);
    if (TVar2 == TESTNODETYPE_ROOT) break;
    local_2c = local_2c + -1;
    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)psStack_18);
    *puVar5 = 0x2e;
    pTStack_28 = (pTStack_28->super_TestNode).m_parent;
  }
  return;
}

Assistant:

void TestNode::getFullPath (std::string& dst) const
{
	dst.clear();

	int				nameLen	= 0;
	const TestNode*	curNode	= this;

	for (;;)
	{
		nameLen += (int)curNode->m_name.length();

		DE_ASSERT(curNode->m_parent);
		if (curNode->m_parent->getNodeType() != TESTNODETYPE_ROOT)
		{
			nameLen += 1;
			curNode  = curNode->m_parent;
		}
		else
			break;
	}

	dst.resize(nameLen);

	curNode = this;
	int pos = nameLen;

	for (;;)
	{
		std::copy(curNode->m_name.begin(), curNode->m_name.end(), dst.begin()+(pos-curNode->m_name.length()));
		pos -= (int)curNode->m_name.length();

		DE_ASSERT(curNode->m_parent);
		if (curNode->m_parent->getNodeType() != TESTNODETYPE_ROOT)
		{
			dst[--pos] = '.';
			curNode = curNode->m_parent;
		}
		else
			break;
	}
}